

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddot.c
# Opt level: O0

double ddot_(int *n,double *sx,int *incx,double *sy,int *incy)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long local_70;
  long iy;
  long ix;
  double stemp;
  long iincy;
  long iincx;
  long nn;
  long m;
  long i;
  int *incy_local;
  double *sy_local;
  int *incx_local;
  double *sx_local;
  int *n_local;
  
  lVar1 = (long)*n;
  lVar2 = (long)*incx;
  lVar3 = (long)*incy;
  ix = 0;
  if (0 < lVar1) {
    if ((lVar2 == 1) && (lVar3 == 1)) {
      for (m = 0; m < lVar1 + -4; m = m + 5) {
        ix = (long)(sx[m + 4] * sy[m + 4] +
                    sx[m + 3] * sy[m + 3] +
                    sx[m + 2] * sy[m + 2] + sx[m] * sy[m] + sx[m + 1] * sy[m + 1] + (double)ix);
      }
      for (; m < lVar1; m = m + 1) {
        ix = (long)(sx[m] * sy[m] + (double)ix);
      }
    }
    else {
      iy = 0;
      local_70 = 0;
      if (lVar2 < 0) {
        iy = (1 - lVar1) * lVar2;
      }
      if (lVar3 < 0) {
        local_70 = (1 - lVar1) * lVar3;
      }
      for (m = 0; m < lVar1; m = m + 1) {
        ix = (long)(sx[iy] * sy[local_70] + (double)ix);
        iy = lVar2 + iy;
        local_70 = lVar3 + local_70;
      }
    }
  }
  return (double)ix;
}

Assistant:

double ddot_(int *n, double *sx, int *incx, double *sy, int *incy)
{
  long int i, m, nn, iincx, iincy;
  double stemp;
  long int ix, iy;

  /* forms the dot product of two vectors.   
     uses unrolled loops for increments equal to one.   
     jack dongarra, linpack, 3/11/78.   
     modified 12/3/93, array(1) declarations changed to array(*) */

  /* Dereference inputs */
  nn = *n;
  iincx = *incx;
  iincy = *incy;

  stemp = 0.0;
  if (nn > 0)
  {
    if (iincx == 1 && iincy == 1) /* code for both increments equal to 1 */
    {
      m = nn-4;
      for (i = 0; i < m; i += 5)
        stemp += sx[i] * sy[i] + sx[i+1] * sy[i+1] + sx[i+2] * sy[i+2] +
                 sx[i+3] * sy[i+3] + sx[i+4] * sy[i+4];

      for ( ; i < nn; i++)        /* clean-up loop */
        stemp += sx[i] * sy[i];
    }
    else /* code for unequal increments or equal increments not equal to 1 */
    {
      ix = 0;
      iy = 0;
      if (iincx < 0)
        ix = (1 - nn) * iincx;
      if (iincy < 0)
        iy = (1 - nn) * iincy;
      for (i = 0; i < nn; i++)
      {
        stemp += sx[ix] * sy[iy];
        ix += iincx;
        iy += iincy;
      }
    }
  }

  return stemp;
}